

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O2

void icetStateDump(void)

{
  IceTState pIVar1;
  uint uVar2;
  
  pIVar1 = icetGetState();
  puts("State dump:");
  for (uVar2 = 0; uVar2 != 0x200; uVar2 = uVar2 + 1) {
    if (pIVar1->type != 0) {
      printf("param       = 0x%x\n",(ulong)uVar2);
      printf("type        = 0x%x\n",(ulong)pIVar1->type);
      printf("num_entries = %d\n",(ulong)(uint)pIVar1->num_entries);
      printf("data        = %p\n",pIVar1->data);
      printf("mod         = %d\n",(ulong)(uint)pIVar1->mod_time);
    }
    pIVar1 = pIVar1 + 1;
  }
  return;
}

Assistant:

void icetStateDump(void)
{
    IceTEnum pname;
    IceTState state;

    state = icetGetState();
    printf("State dump:\n");
    for (pname = ICET_STATE_ENGINE_START;
         pname < ICET_STATE_ENGINE_END;
         pname++) {
        stateCheck(pname, state);
        if (state->type != ICET_NULL) {
            printf("param       = 0x%x\n", pname);
            printf("type        = 0x%x\n", (int)state->type);
            printf("num_entries = %d\n", (int)state->num_entries);
            printf("data        = %p\n", state->data);
            printf("mod         = %d\n", (int)state->mod_time);
        }
        state++;
    }
}